

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ExceptionOr<kj::_::Void> *
kj::_::HeapArrayDisposer::allocate<kj::_::ExceptionOr<kj::_::Void>>(size_t count)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  
  pEVar1 = (ExceptionOr<kj::_::Void> *)
           allocateImpl(0x1a0,count,count,Allocate_<kj::_::ExceptionOr<kj::_::Void>_>::construct,
                        ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>_>::destruct);
  return pEVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}